

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptUtils.cpp
# Opt level: O0

int getIntOrCrash(Object *object)

{
  int iVar1;
  runtime_error *prVar2;
  long local_60;
  long local_50;
  Variable *objectVariable;
  ObjectInt *objectInt;
  ObjectType type;
  Object *object_local;
  
  if (object == (Object *)0x0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"ScriptUtils::getIntOrCrash => object is null!");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = (**object->_vptr_Object)();
  if ((char)iVar1 == '\0') {
    if (object == (Object *)0x0) {
      local_50 = 0;
    }
    else {
      local_50 = __dynamic_cast(object,&Object::typeinfo,&ObjectInt::typeinfo,0);
    }
    object_local._4_4_ = *(int *)(local_50 + 8);
  }
  else {
    if ((char)iVar1 != '\x02') {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar2,"ScriptUtils::getIntOrCrash => wrong type!");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (object == (Object *)0x0) {
      local_60 = 0;
    }
    else {
      local_60 = __dynamic_cast(object,&Object::typeinfo,&Variable::typeinfo,0);
    }
    object_local._4_4_ = getIntOrCrash(*(Object **)(local_60 + 8));
  }
  return object_local._4_4_;
}

Assistant:

int getIntOrCrash(Object* object) {
	if (object == nullptr) {
		throw std::runtime_error("ScriptUtils::getIntOrCrash => object is null!");
	}
	ObjectType type = object->getType();
	if (type == OT_INT) {
		auto *objectInt = dynamic_cast<ObjectInt *>(object);
		return objectInt->value;
	} else if (type == OT_VARIABLE) {
		auto *objectVariable = dynamic_cast<Variable *>(object);
		return getIntOrCrash(objectVariable->value);
	} else {
		throw std::runtime_error("ScriptUtils::getIntOrCrash => wrong type!");
	}
}